

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O0

void __thiscall rcdiscover::DeviceInfo::clear(DeviceInfo *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  std::__cxx11::string::erase(in_RDI + 0x40,0);
  std::__cxx11::string::erase(in_RDI + 0x60,0);
  std::__cxx11::string::erase(in_RDI + 0x80,0);
  std::__cxx11::string::erase(in_RDI + 0xa0,0);
  std::__cxx11::string::erase(in_RDI + 0xc0,0);
  std::__cxx11::string::erase(in_RDI + 0xe0,0);
  return;
}

Assistant:

void DeviceInfo::clear()
{
  major=minor=0;
  mac=0;
  ip=0;
  subnet=0;
  gateway=0;

  manufacturer_name.erase();
  model_name.erase();
  device_version.erase();
  manufacturer_info.erase();
  serial_number.erase();
  user_name.erase();
}